

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillLeftBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Orientation OVar2;
  
  while( true ) {
    dVar1 = node->point->x;
    if (dVar1 < edge->p->x || dVar1 == edge->p->x) {
      return;
    }
    OVar2 = Orient2d(node->point,node->prev->point,node->prev->prev->point);
    if (OVar2 == CW) break;
    FillLeftConvexEdgeEvent(this,tcx,edge,node);
  }
  FillLeftConcaveEdgeEvent(this,tcx,edge,node);
  return;
}

Assistant:

void Sweep::FillLeftBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x > edge->p->x) {
    if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
      // Concave
      FillLeftConcaveEdgeEvent(tcx, edge, node);
    } else {
      // Convex
      FillLeftConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillLeftBelowEdgeEvent(tcx, edge, node);
    }
  }
}